

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupOrderDfsChoices(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *p_local;
  
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    Gia_ManFillValue(p);
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar3;
    iVar1 = Gia_ManObjNum(p);
    piVar4 = (int *)calloc((long)iVar1,4);
    p_00->pNexts = piVar4;
    pGVar5 = Gia_ManConst0(p);
    pGVar5->Value = 0;
    local_24 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar6 = false;
      if (local_24 < iVar1) {
        pGStack_20 = Gia_ManCi(p,local_24);
        bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pGStack_20->Value = uVar2;
      local_24 = local_24 + 1;
    }
    local_24 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar6 = false;
      if (local_24 < iVar1) {
        pGStack_20 = Gia_ManCo(p,local_24);
        bVar6 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      pGVar5 = Gia_ObjFanin0(pGStack_20);
      Gia_ManDupOrderDfsChoices_rec(p_00,p,pGVar5);
      iVar1 = Gia_ObjFanin0Copy(pGStack_20);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      pGStack_20->Value = uVar2;
      local_24 = local_24 + 1;
    }
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,iVar1);
    return p_00;
  }
  __assert_fail("p->pReprs && p->pNexts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x1b7,"Gia_Man_t *Gia_ManDupOrderDfsChoices(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOrderDfsChoices( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs && p->pNexts );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
    {
        Gia_ManDupOrderDfsChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
//    Gia_ManDeriveReprs( pNew );
    return pNew;
}